

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_sort_key.cpp
# Opt level: O2

idx_t duckdb::SortKeyBlobOperator::Decode
                (const_data_ptr_t input,Vector *result,idx_t result_idx,bool flip_bytes)

{
  anon_union_16_2_67f50693_for_value *paVar1;
  byte bVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  byte bVar5;
  undefined7 in_register_00000009;
  char *pcVar6;
  byte bVar7;
  Vector *vector;
  ulong uVar8;
  bool bVar9;
  anon_struct_16_3_d7536bce_for_pointer aVar10;
  
  pdVar3 = result->data;
  bVar9 = (int)CONCAT71(in_register_00000009,flip_bytes) != 0;
  bVar7 = 1;
  if (bVar9) {
    bVar7 = 0xfe;
  }
  bVar5 = 0xff;
  if (!bVar9) {
    bVar5 = 0;
  }
  uVar8 = 0;
  vector = (Vector *)0x0;
  while( true ) {
    bVar2 = input[uVar8];
    if (bVar5 == bVar2) break;
    vector = (Vector *)&vector->field_0x1;
    uVar8 = uVar8 + (bVar7 == bVar2) + 1;
  }
  aVar10 = (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::EmptyString((StringVector *)result,vector,(ulong)bVar2);
  paVar1 = (anon_union_16_2_67f50693_for_value *)(pdVar3 + result_idx * 0x10);
  paVar1->pointer = aVar10;
  pcVar6 = aVar10.ptr;
  if (aVar10.length < 0xd) {
    pcVar6 = (paVar1->pointer).prefix;
  }
  for (uVar4 = 0; uVar4 < uVar8; uVar4 = uVar4 + (bVar7 == bVar5) + 1) {
    bVar5 = input[uVar4];
    *pcVar6 = input[uVar4 + (bVar7 == bVar5)] ^ -flip_bytes;
    pcVar6 = pcVar6 + 1;
  }
  string_t::Finalize((string_t *)(pdVar3 + result_idx * 0x10));
  return uVar8 + 1;
}

Assistant:

static idx_t Decode(const_data_ptr_t input, Vector &result, idx_t result_idx, bool flip_bytes) {
		auto result_data = FlatVector::GetData<TYPE>(result);
		// scan until we find the delimiter, keeping in mind escapes
		data_t string_delimiter = SortKeyVectorData::STRING_DELIMITER;
		data_t escape_character = SortKeyVectorData::BLOB_ESCAPE_CHARACTER;
		if (flip_bytes) {
			string_delimiter = ~string_delimiter;
			escape_character = ~escape_character;
		}
		idx_t blob_len = 0;
		idx_t pos;
		for (pos = 0; input[pos] != string_delimiter; pos++) {
			blob_len++;
			if (input[pos] == escape_character) {
				// escape character - skip the next byte
				pos++;
			}
		}
		// now allocate the blob data and fill it with the decoded data
		result_data[result_idx] = StringVector::EmptyString(result, blob_len);
		auto str_data = data_ptr_cast(result_data[result_idx].GetDataWriteable());
		for (idx_t input_pos = 0, result_pos = 0; input_pos < pos; input_pos++) {
			if (input[input_pos] == escape_character) {
				// if we encounter an escape character - copy the NEXT byte
				input_pos++;
			}
			if (flip_bytes) {
				str_data[result_pos++] = ~input[input_pos];
			} else {
				str_data[result_pos++] = input[input_pos];
			}
		}
		result_data[result_idx].Finalize();
		return pos + 1;
	}